

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O2

void __thiscall GcHeap::GcHeapImpl::~GcHeapImpl(GcHeapImpl *this)

{
  munmap(this->heap_start,this->number_of_pages << 0xc);
  std::__cxx11::_List_base<Sexp_*,_std::allocator<Sexp_*>_>::_M_clear
            (&(this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>);
  std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base
            (&(this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>);
  std::
  _Hashtable<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->forwarding_addresses)._M_h);
  return;
}

Assistant:

~GcHeapImpl() { UnmapTheHeap(heap_start, PAGE_SIZE * number_of_pages); }